

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

int ON_CompareDouble(double a,double b)

{
  double b_local;
  double a_local;
  
  if (b <= a) {
    if (a <= b) {
      if ((a != b) || (NAN(a) || NAN(b))) {
        if (NAN(a)) {
          if (NAN(b)) {
            a_local._4_4_ = 0;
          }
          else {
            a_local._4_4_ = 1;
          }
        }
        else {
          a_local._4_4_ = -1;
        }
      }
      else {
        a_local._4_4_ = 0;
      }
    }
    else {
      a_local._4_4_ = 1;
    }
  }
  else {
    a_local._4_4_ = -1;
  }
  return a_local._4_4_;
}

Assistant:

int ON_CompareDouble(
  double a,
  double b
  )
{
  if (a < b)
    return -1;
  if (a > b)
    return 1;
  if (a == b)
    return 0;

  // below this point, a and/or b is a nan


  if (a == a)
    return -1; // b is a nan
  
  if (b == b)
    return 1; // ab is a nan

  return 0; // both a and b are nans
}